

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::Message::Utf8DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  undefined1 local_70 [8];
  Printer printer;
  Message *this_local;
  string *debug_string;
  
  printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::Printer((Printer *)local_70);
  TextFormat::Printer::SetUseUtf8StringEscaping((Printer *)local_70,true);
  TextFormat::Printer::SetExpandAny((Printer *)local_70,true);
  TextFormat::Printer::PrintToString((Printer *)local_70,this,__return_storage_ptr__);
  printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  TextFormat::Printer::~Printer((Printer *)local_70);
  if ((printer.custom_printers_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string Message::Utf8DebugString() const {
  string debug_string;

  TextFormat::Printer printer;
  printer.SetUseUtf8StringEscaping(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}